

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

e_uint32 OPLL_setMask(OPLL *opll,e_uint32 mask)

{
  e_uint32 ret;
  e_uint32 mask_local;
  OPLL *opll_local;
  
  if (opll == (OPLL *)0x0) {
    opll_local._4_4_ = 0;
  }
  else {
    opll_local._4_4_ = opll->mask;
    opll->mask = mask;
  }
  return opll_local._4_4_;
}

Assistant:

e_uint32
OPLL_setMask (OPLL * opll, e_uint32 mask)
{
  e_uint32 ret;

  if (opll)
  {
    ret = opll->mask;
    opll->mask = mask;
    return ret;
  }
  else
    return 0;
}